

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  _Head_base<0UL,_const_ot::commissioner::SecurityPolicy_&,_false> local_38;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar3 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *)
              ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::Matches
                      (this_00,args);
    if (bVar2) {
      this_01 = OnCallSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
                GetAction(this_00);
      local_38._M_head_impl =
           (args->super__Tuple_impl<0UL,_const_ot::commissioner::SecurityPolicy_&>).
           super__Head_base<0UL,_const_ot::commissioner::SecurityPolicy_&,_false>._M_head_impl;
      Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::Perform
                (__return_storage_ptr__,this_01,(ArgumentTuple *)&local_38);
      return __return_storage_ptr__;
    }
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_58);
  if (DefaultValue<ot::commissioner::Error>::producer_ == (long *)0x0) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (**(code **)(*DefaultValue<ot::commissioner::Error>::producer_ + 0x10))(__return_storage_ptr__);
  }
  if (local_58[0] == local_48) {
    return __return_storage_ptr__;
  }
  operator_delete(local_58[0]);
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }